

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_reader.h
# Opt level: O0

ReadResult __thiscall
ximu::PacketReader::read<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
          (PacketReader *this,
          _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *begin,
          _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *end)

{
  uchar uVar1;
  reference pvVar2;
  byte *pbVar3;
  size_type sVar4;
  size_t sVar5;
  iterator iVar6;
  iterator end_00;
  uint *end_01;
  RawAnalogueInputData RVar7;
  QuaternionData QVar8;
  float local_2c8;
  float fStack_2c4;
  float local_2b8;
  float fStack_2b4;
  undefined8 local_228;
  RawAnalogueInputData anl_1;
  undefined1 local_208 [8];
  CalAnalogueInputData anl;
  FourChannelData<unsigned_short> local_1d8;
  PWMOutputData pwm;
  undefined1 local_1c0 [8];
  RawAdxl345BusData adxl_1;
  undefined1 local_198 [8];
  CalAdxl345BusData adxl;
  undefined1 local_152 [2];
  iterator iStack_150;
  DigitalIOData did;
  undefined1 local_140 [8];
  DateTimeData wdt;
  float local_100;
  float fStack_fc;
  QuaternionData qd;
  undefined1 local_dc [8];
  CalInertialAndMagneticData cimd;
  PacketHeaders header;
  uchar *local_a8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  uchar local_95;
  uchar checksum;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_88;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_80;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_60;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *end_local;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *begin_local;
  PacketReader *this_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)end;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::_Deque_iterator
            (&local_60,begin);
  std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::_Deque_iterator
            (&local_80,end);
  local_88 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  PacketEncoding::
  decodePacket<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_60,&local_80,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             local_88);
  local_a0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  _header = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  local_a8 = (uchar *)__gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator-((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&header,1);
  uVar1 = PacketConstruction::
          checksum<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_a0,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )local_a8);
  local_95 = uVar1;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  if (uVar1 == *pvVar2) {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    cimd._magnetometer._y = (float)(uint)*pbVar3;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    sVar5 = PacketSize(this,(PacketHeaders)cimd._magnetometer._y);
    if (sVar4 == sVar5) {
      end_01 = &switchD_0010e21c::switchdataD_001140a8;
      switch(cimd._magnetometer._y) {
      case 7.00649e-45:
        iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        iStack_150 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        PacketDeconstruction::
        deconstructWriteDateTimeData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((DateTimeData *)local_140,(PacketDeconstruction *)iVar6._M_current,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )iStack_150._M_current,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )end_01);
        (*this->_vptr_PacketReader[2])(this,local_140);
        this_local._4_4_ = OKE;
        break;
      default:
        this_local._4_4_ = NOT_IMPLEMENTED;
        break;
      case 1.26117e-44:
        iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        qd._8_8_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        PacketDeconstruction::
        deconstructCalInertialAndMagneticData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((CalInertialAndMagneticData *)local_dc,(PacketDeconstruction *)iVar6._M_current,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )qd._8_8_,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )end_01);
        (*this->_vptr_PacketReader[1])(this,local_dc);
        this_local._4_4_ = OKE;
        break;
      case 1.4013e-44:
        iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        wdt._seconds = (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          local_40);
        QVar8 = PacketDeconstruction::
                deconstructQuaternionData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )iVar6._M_current,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )wdt._seconds);
        local_2c8 = QVar8._y;
        fStack_2c4 = QVar8._z;
        local_2b8 = QVar8._w;
        fStack_2b4 = QVar8._x;
        local_100 = local_2b8;
        fStack_fc = fStack_2b4;
        qd._w = local_2c8;
        qd._x = fStack_2c4;
        (**this->_vptr_PacketReader)(this,&local_100);
        this_local._4_4_ = OKE;
        break;
      case 1.54143e-44:
        iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        adxl.super_FourChannelData<ximu::Vector3<float>_>._channelD._4_8_ =
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        PacketDeconstruction::
        deconstructDigitalIOData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_152,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )iVar6._M_current);
        (*this->_vptr_PacketReader[3])(this,local_152);
        this_local._4_4_ = OKE;
        break;
      case 1.68156e-44:
        iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        end_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        RVar7 = PacketDeconstruction::
                deconstructRawAnalogueInputData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )iVar6._M_current,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )end_00._M_current);
        anl_1.super_EightChannelData<short>._0_8_ = RVar7.super_EightChannelData<short>._8_8_;
        local_228 = RVar7.super_EightChannelData<short>._0_8_;
        (*this->_vptr_PacketReader[8])(this,&local_228);
        this_local._4_4_ = OKE;
        break;
      case 1.82169e-44:
        iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        anl_1.super_EightChannelData<short>._8_8_ =
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        PacketDeconstruction::
        deconstructCalAnalogueInputData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((CalAnalogueInputData *)local_208,(PacketDeconstruction *)iVar6._M_current,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )anl_1.super_EightChannelData<short>._8_8_,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )end_01);
        (*this->_vptr_PacketReader[7])(this,local_208);
        this_local._4_4_ = OKE;
        break;
      case 1.96182e-44:
        iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        anl.super_EightChannelData<float>._24_8_ =
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        local_1d8 = (FourChannelData<unsigned_short>)
                    PacketDeconstruction::
                    deconstructPWMOutputData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )iVar6._M_current,
                               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )anl.super_EightChannelData<float>._24_8_);
        (*this->_vptr_PacketReader[6])(this,&local_1d8);
        this_local._4_4_ = OKE;
        break;
      case 2.10195e-44:
        iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        pwm.super_FourChannelData<unsigned_short> =
             (FourChannelData<unsigned_short>)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        PacketDeconstruction::
        deconstructRawAdxl345BusData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((RawAdxl345BusData *)local_1c0,(PacketDeconstruction *)iVar6._M_current,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )pwm.super_FourChannelData<unsigned_short>,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )end_01);
        (*this->_vptr_PacketReader[5])(this,local_1c0);
        this_local._4_4_ = OKE;
        break;
      case 2.24208e-44:
        iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        adxl_1.super_FourChannelData<ximu::Vector3<short>_>._16_8_ =
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        PacketDeconstruction::
        deconstructCalAdxl345BusData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((CalAdxl345BusData *)local_198,(PacketDeconstruction *)iVar6._M_current,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )adxl_1.super_FourChannelData<ximu::Vector3<short>_>._16_8_,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )end_01);
        (*this->_vptr_PacketReader[4])(this,local_198);
        this_local._4_4_ = OKE;
      }
    }
    else {
      this_local._4_4_ = INVALID_PACKET_SIZE;
    }
  }
  else {
    this_local._4_4_ = INVALID_CHECKSUM;
  }
  cimd._magnetometer._z = 1.4013e-45;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return this_local._4_4_;
}

Assistant:

ReadResult read(InputIterator begin, InputIterator end) {
    // working buffer
    std::vector<unsigned char> buffer;

    // decode packet
    PacketEncoding::decodePacket(begin, end, std::back_inserter(buffer));

    // test checksum
    auto checksum = PacketConstruction::checksum(
        buffer.begin(), buffer.end() - 1);

    if (checksum != buffer.back())
      return ReadResult::INVALID_CHECKSUM;

    // get the header
    auto header = static_cast<ximu::PacketHeaders>(buffer[0]);

    // packets have an associated size
    if (buffer.size() != PacketSize(header))
      return ReadResult::INVALID_PACKET_SIZE;

    // todo @aukedirk make use of enum returned
    switch (header) {
      case PacketHeaders::CAL_INERTIAL_AND_MAGNETIC_DATA:
      {
	auto cimd = PacketDeconstruction::deconstructCalInertialAndMagneticData(
          buffer.begin(), buffer.end());
        recievedCalInertialAndMagneticData(cimd);  
	return ReadResult::OKE;
      }
      case PacketHeaders::QUATERNION_DATA:
      {
	auto qd = PacketDeconstruction::deconstructQuaternionData(
		      buffer.begin(),buffer.end());
	recievedQuaternionData(qd);
	return ReadResult::OKE;
      }
      case PacketHeaders::WRITE_DATETIME:
      {
	auto wdt = PacketDeconstruction::deconstructWriteDateTimeData(
	  buffer.begin(),buffer.end());
	recievedDateTimeData(wdt);
	return ReadResult::OKE;
      }
      case PacketHeaders::DIGITAL_IO_DATA:
      {
	auto did = PacketDeconstruction::deconstructDigitalIOData(
	  buffer.begin(),buffer.end());
	recievedDigitalIOData(did);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::CAL_ADXL_345_BUS_DATA:
      {
	auto adxl = PacketDeconstruction::deconstructCalAdxl345BusData
	  (buffer.begin(),buffer.end());
	recievedCalAdxl345BusData(adxl);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::RAW_ADXL_345_BUS_DATA:
      {
	auto adxl = PacketDeconstruction::deconstructRawAdxl345BusData
	  (buffer.begin(),buffer.end());
	recievedRawAdxl345BusData(adxl);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::PWM_OUTPUT_DATA:
      {
	auto pwm = PacketDeconstruction::deconstructPWMOutputData
	(buffer.begin(),buffer.end());
	recievedPWMOutputData(pwm);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::CAL_ANALOGUE_INPUT_DATA:
      {
	auto anl = PacketDeconstruction::deconstructCalAnalogueInputData
	(buffer.begin(),buffer.end());
	recievedCalAnalogueInputData(anl);
	return ReadResult::OKE;
      }
      
      case PacketHeaders::RAW_ANALOGUE_INPUT_DATA:
      {
	auto anl = PacketDeconstruction::deconstructRawAnalogueInputData
	(buffer.begin(),buffer.end());
	recievedRawAnalogueInputData(anl);
	return ReadResult::OKE;
      }
    }
    return ReadResult::NOT_IMPLEMENTED;
  }